

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_function_expression.cpp
# Opt level: O3

string * __thiscall
duckdb::BoundFunctionExpression::ToString_abi_cxx11_
          (string *__return_storage_ptr__,BoundFunctionExpression *this)

{
  uint in_stack_ffffffffffffff94;
  bool in_stack_ffffffffffffffa0;
  string local_58;
  _func_int **local_38;
  ExpressionType local_30;
  ExpressionClass EStack_2f;
  undefined6 uStack_2e;
  undefined1 local_28;
  
  local_30 = INVALID;
  EStack_2f = INVALID;
  uStack_2e = 0;
  local_28 = 0;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = (_func_int **)&stack0xffffffffffffffd8;
  FunctionExpression::
  ToString<duckdb::BoundFunctionExpression,duckdb::Expression,duckdb::OrderModifier>
            (__return_storage_ptr__,(FunctionExpression *)this,
             (BoundFunctionExpression *)&stack0xffffffffffffffc8,&local_58,
             &(this->function).super_BaseScalarFunction.super_SimpleFunction.super_Function.name,
             (string *)(ulong)this->is_operator,false,false,(Expression *)0x0,
             (OrderModifier *)((ulong)in_stack_ffffffffffffff94 << 0x20),false,
             in_stack_ffffffffffffffa0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if (local_38 != (_func_int **)&stack0xffffffffffffffd8) {
    operator_delete(local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

string BoundFunctionExpression::ToString() const {
	return FunctionExpression::ToString<BoundFunctionExpression, Expression>(*this, string(), string(), function.name,
	                                                                         is_operator);
}